

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

StackNode *
stack_node_new(StackNode *previous_node,Subtree subtree,_Bool is_pending,TSStateId state,
              StackNodeArray *pool)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 *puVar4;
  uint uVar6;
  StackNode *pSVar7;
  StackNode *extraout_RAX;
  StackNode *extraout_RAX_00;
  StackNode *extraout_RAX_01;
  int iVar8;
  ulong uVar9;
  SubtreePool *pool_00;
  SubtreePool *pool_01;
  Subtree *pSVar10;
  void *pvVar11;
  Subtree pool_02;
  ulong uVar12;
  StackNodeArray *pool_03;
  uint32_t uVar13;
  void *__ptr;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint32_t uVar17;
  long *__nmemb;
  Length result;
  undefined4 uStack_44;
  int iStack_34;
  
  if (pool->size == 0) {
    __ptr = (void *)0xe8;
    pool_02 = subtree;
    pSVar7 = (StackNode *)malloc(0xe8);
    if (pSVar7 == (StackNode *)0x0) {
      stack_node_new_cold_1();
      do {
        if (*(int *)((long)__ptr + 0xd4) == 0) {
          __assert_fail("self->ref_count != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x60,
                        "void stack_node_release(StackNode *, StackNodeArray *, SubtreePool *)");
        }
        uVar6 = *(int *)((long)__ptr + 0xd4) - 1;
        *(uint *)((long)__ptr + 0xd4) = uVar6;
        if (uVar6 != 0) {
          return (StackNode *)(ulong)uVar6;
        }
        if (*(ushort *)((long)__ptr + 0xd0) == 0) {
          pvVar11 = (void *)0x0;
        }
        else {
          uVar6 = *(ushort *)((long)__ptr + 0xd0) - 1;
          if (uVar6 != 0) {
            uVar12 = (ulong)uVar6;
            pSVar10 = (Subtree *)((long)__ptr + uVar12 * 0x18 + 0x18);
            do {
              uVar12 = uVar12 - 1;
              pSVar7 = (StackNode *)pSVar10[-1].ptr;
              if ((*pSVar10).ptr != (SubtreeHeapData *)0x0) {
                ts_subtree_release(pool_00,*pSVar10);
              }
              stack_node_release(pSVar7,(StackNodeArray *)pool_02.ptr,pool_00);
              pSVar10 = pSVar10 + -3;
            } while ((int)uVar12 != 0);
          }
          if ((*(Subtree *)((long)__ptr + 0x18)).ptr != (SubtreeHeapData *)0x0) {
            ts_subtree_release(pool_00,*(Subtree *)((long)__ptr + 0x18));
          }
          pvVar11 = *(void **)((long)__ptr + 0x10);
        }
        uVar6 = ((pool_02.ptr)->padding).extent.row;
        if (uVar6 < 0x32) {
          pSVar7 = *(StackNode **)pool_02.ptr;
          if (uVar6 == ((pool_02.ptr)->padding).extent.column) {
            uVar2 = uVar6 * 2;
            if (uVar6 * 2 < 9) {
              uVar2 = 8;
            }
            __nmemb = (long *)(ulong)uVar2;
            if (pSVar7 == (StackNode *)0x0) {
              pool_03 = (StackNodeArray *)&DAT_00000008;
              pSVar7 = (StackNode *)calloc((size_t)__nmemb,8);
              if (pSVar7 == (StackNode *)0x0) goto LAB_0012fe67;
            }
            else {
              pool_03 = (StackNodeArray *)((long)__nmemb * 8);
              pSVar7 = (StackNode *)realloc(pSVar7,(size_t)pool_03);
              if (pSVar7 == (StackNode *)0x0) {
                stack_node_release_cold_1();
LAB_0012fe67:
                stack_node_release_cold_2();
                if (*__nmemb == 0) {
                  return extraout_RAX_00;
                }
                if ((*(Subtree *)(__nmemb + 1)).ptr != (SubtreeHeapData *)0x0) {
                  ts_subtree_release(pool_01,*(Subtree *)(__nmemb + 1));
                }
                puVar4 = (undefined8 *)__nmemb[2];
                if (puVar4 != (undefined8 *)0x0) {
                  free((void *)*puVar4);
                  *puVar4 = 0;
                  puVar4[1] = 0;
                  free((void *)__nmemb[2]);
                }
                stack_node_release((StackNode *)*__nmemb,pool_03,pool_01);
                return extraout_RAX_01;
              }
              uVar6 = ((pool_02.ptr)->padding).extent.row;
            }
            *(StackNode **)pool_02.ptr = pSVar7;
            ((pool_02.ptr)->padding).extent.column = uVar2;
          }
          ((pool_02.ptr)->padding).extent.row = uVar6 + 1;
          *(void **)((long)pSVar7->links + (ulong)uVar6 * 8 + -0x10) = __ptr;
        }
        else {
          free(__ptr);
          pSVar7 = extraout_RAX;
        }
        __ptr = pvVar11;
        if (pvVar11 == (void *)0x0) {
          return pSVar7;
        }
      } while( true );
    }
  }
  else {
    uVar6 = pool->size - 1;
    pool->size = uVar6;
    pSVar7 = pool->contents[uVar6];
  }
  pSVar7->state = state;
  memset(&pSVar7->field_0x2,0,0xd2);
  pSVar7->ref_count = 1;
  pSVar7->error_cost = 0;
  pSVar7->node_count = 0;
  *(undefined8 *)&pSVar7->dynamic_precedence = 0;
  if (previous_node == (StackNode *)0x0) {
    (pSVar7->position).extent.column = 0;
  }
  else {
    pSVar7->link_count = 1;
    pSVar7->links[0].node = previous_node;
    pSVar7->links[0].subtree = subtree;
    pSVar7->links[0].is_pending = is_pending;
    uVar13 = (previous_node->position).extent.row;
    (pSVar7->position).bytes = (previous_node->position).bytes;
    (pSVar7->position).extent.row = uVar13;
    (pSVar7->position).extent.column = (previous_node->position).extent.column;
    uVar6 = previous_node->error_cost;
    pSVar7->error_cost = uVar6;
    iVar1 = previous_node->dynamic_precedence;
    pSVar7->dynamic_precedence = iVar1;
    uVar2 = previous_node->node_count;
    pSVar7->node_count = uVar2;
    if (subtree.ptr != (SubtreeHeapData *)0x0) {
      if (((ulong)subtree.ptr & 1) == 0) {
        uVar13 = 0x262;
        if (((subtree.ptr)->field_0x2c & 0x80) == 0) {
          uVar13 = (subtree.ptr)->error_cost;
        }
        pSVar7->error_cost = uVar13 + uVar6;
        uVar12._0_4_ = ((Length *)((long)subtree + 4))->bytes;
        uVar12._4_4_ = (((Length *)((long)subtree + 4))->extent).row;
        uVar13 = ((subtree.ptr)->padding).extent.column;
        uVar15._0_4_ = ((Length *)((long)subtree + 0x10))->bytes;
        uVar15._4_4_ = (((Length *)((long)subtree + 0x10))->extent).row;
        uVar17 = ((subtree.ptr)->size).extent.column;
        iVar8 = uVar15._4_4_;
      }
      else {
        uVar14 = uVar6 + 0x262;
        if (((ulong)subtree.ptr & 0x20) == 0) {
          uVar14 = uVar6;
        }
        pSVar7->error_cost = uVar14;
        uVar13 = subtree._4_4_ & 0xff;
        uVar12 = (ulong)subtree.ptr >> 8 & 0xf00000000 | (ulong)(subtree._2_4_ & 0xff);
        uVar15 = (ulong)subtree.ptr >> 0x18 & 0xff;
        uVar17 = (uint32_t)uVar15;
        iVar8 = 0;
      }
      uStack_44 = (undefined4)(uVar12 >> 0x20);
      uVar16 = CONCAT44(uVar13,uStack_44) + CONCAT44(uVar17,iVar8);
      uVar9 = uVar16 & 0xffffffff | (ulong)uVar17 << 0x20;
      if (iVar8 == 0) {
        uVar9 = uVar16;
      }
      iStack_34 = (int)uVar9;
      uVar3 = (pSVar7->position).bytes;
      uVar5 = (pSVar7->position).extent.row;
      uVar16 = CONCAT44((pSVar7->position).extent.column,uVar5) + uVar9;
      uVar9 = uVar16 & 0xffffffff | uVar9 & 0xffffffff00000000;
      if (iStack_34 == 0) {
        uVar9 = uVar16;
      }
      iStack_34 = (int)uVar9;
      (pSVar7->position).bytes = (int)uVar12 + (int)uVar15 + uVar3;
      (pSVar7->position).extent.row = iStack_34;
      (pSVar7->position).extent.column = (uint32_t)(uVar9 >> 0x20);
      if ((((ulong)subtree.ptr & 1) == 0) && ((subtree.ptr)->child_count != 0)) {
        pSVar7->node_count = uVar2 + ((subtree.ptr)->field_17).field_0.node_count;
        iVar8 = ((subtree.ptr)->field_17).field_0.dynamic_precedence;
      }
      else {
        pSVar7->node_count = uVar2 + 1;
        iVar8 = 0;
      }
      pSVar7->dynamic_precedence = iVar8 + iVar1;
    }
  }
  return pSVar7;
}

Assistant:

static StackNode *stack_node_new(StackNode *previous_node, Subtree subtree,
                                 bool is_pending, TSStateId state, StackNodeArray *pool) {
  StackNode *node = pool->size > 0 ?
    array_pop(pool) :
    ts_malloc(sizeof(StackNode));
  *node = (StackNode){.ref_count = 1, .link_count = 0, .state = state};

  if (previous_node) {
    node->link_count = 1;
    node->links[0] = (StackLink){
      .node = previous_node,
      .subtree = subtree,
      .is_pending = is_pending,
    };

    node->position = previous_node->position;
    node->error_cost = previous_node->error_cost;
    node->dynamic_precedence = previous_node->dynamic_precedence;
    node->node_count = previous_node->node_count;

    if (subtree.ptr) {
      node->error_cost += ts_subtree_error_cost(subtree);
      node->position = length_add(node->position, ts_subtree_total_size(subtree));
      node->node_count += ts_subtree_node_count(subtree);
      node->dynamic_precedence += ts_subtree_dynamic_precedence(subtree);
    }
  } else {
    node->position = length_zero();
    node->error_cost = 0;
  }

  return node;
}